

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base64.cpp
# Opt level: O3

string_t __thiscall
duckdb::Base64EncodeOperator::Operation<duckdb::string_t,duckdb::string_t>
          (Base64EncodeOperator *this,string_t input,Vector *result)

{
  undefined8 uVar1;
  ulong uVar2;
  char *pcVar3;
  string_t sVar4;
  string_t sVar5;
  string_t result_str;
  undefined1 local_28 [16];
  
  sVar4.value._8_8_ = input.value._0_8_;
  sVar4.value._0_8_ = this;
  uVar2 = duckdb::Blob::ToBase64Size(sVar4);
  local_28 = duckdb::StringVector::EmptyString(input.value._8_8_,uVar2);
  pcVar3 = local_28._8_8_;
  if (local_28._0_4_ < 0xd) {
    pcVar3 = local_28 + 4;
  }
  sVar5.value.pointer.ptr = (char *)sVar4.value._8_8_;
  sVar5.value._0_8_ = this;
  duckdb::Blob::ToBase64(sVar5,pcVar3);
  uVar1 = local_28._0_8_;
  uVar2 = uVar1 & 0xffffffff;
  if (uVar2 < 0xd) {
    memset(local_28 + 4 + uVar2,0,0xc - uVar2);
  }
  else {
    local_28._4_4_ = *(undefined4 *)local_28._8_8_;
  }
  return (anon_union_16_2_67f50693_for_value)(anon_union_16_2_67f50693_for_value)local_28;
}

Assistant:

static RESULT_TYPE Operation(INPUT_TYPE input, Vector &result) {
		auto result_str = StringVector::EmptyString(result, Blob::ToBase64Size(input));
		Blob::ToBase64(input, result_str.GetDataWriteable());
		result_str.Finalize();
		return result_str;
	}